

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_render_size(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined4 *puVar2;
  long lVar3;
  aom_codec_err_t aVar4;
  undefined8 *puVar5;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar5 + 1;
  }
  puVar2 = (undefined4 *)*puVar5;
  if (puVar2 == (undefined4 *)0x0) {
    aVar4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      lVar3 = *ctx->frame_worker->data1;
      *puVar2 = *(undefined4 *)(lVar3 + 0x3ba0);
      puVar2[1] = *(undefined4 *)(lVar3 + 0x3ba4);
      return AOM_CODEC_OK;
    }
    aVar4 = AOM_CODEC_ERROR;
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t ctrl_get_render_size(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  int *const render_size = va_arg(args, int *);

  if (render_size) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;
      render_size[0] = cm->render_width;
      render_size[1] = cm->render_height;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}